

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O1

UnicodeSet * anon_unknown.dwarf_29b1d3::computeUnion(Key k1,Key k2)

{
  UnicodeSet *this;
  undefined4 in_register_00000034;
  undefined1 *puVar1;
  
  this = (UnicodeSet *)
         icu_63::UMemory::operator_new((UMemory *)0x58,CONCAT44(in_register_00000034,k2));
  if (this == (UnicodeSet *)0x0) {
    this = (UnicodeSet *)0x0;
  }
  else {
    icu_63::UnicodeSet::UnicodeSet(this);
  }
  if (this == (UnicodeSet *)0x0) {
    this = (UnicodeSet *)0x0;
  }
  else {
    puVar1 = (undefined1 *)DAT_003c62c8;
    if (DAT_003c62c8 == (UnicodeSet *)0x0) {
      puVar1 = (anonymous_namespace)::gEmptyUnicodeSet;
    }
    icu_63::UnicodeSet::addAll(this,(UnicodeSet *)puVar1);
    puVar1 = (undefined1 *)(&(anonymous_namespace)::gUnicodeSets)[k1];
    if ((UnicodeSet *)puVar1 == (UnicodeSet *)0x0) {
      puVar1 = (anonymous_namespace)::gEmptyUnicodeSet;
    }
    icu_63::UnicodeSet::addAll(this,(UnicodeSet *)puVar1);
    icu_63::UnicodeSet::freeze(this);
  }
  return this;
}

Assistant:

UnicodeSet* computeUnion(Key k1, Key k2) {
    UnicodeSet* result = new UnicodeSet();
    if (result == nullptr) {
        return nullptr;
    }
    result->addAll(*getImpl(k1));
    result->addAll(*getImpl(k2));
    result->freeze();
    return result;
}